

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocl_init.cpp
# Opt level: O3

OclLibrary oclLoadLibrary(void)

{
  OclLibrary pvVar1;
  
  pvVar1 = (OclLibrary)dlopen("libOpenCL.so",2);
  if (pvVar1 != (OclLibrary)0x0) {
    return pvVar1;
  }
  pvVar1 = (OclLibrary)dlopen("libOpenCL.so.1",2);
  return pvVar1;
}

Assistant:

OclLibrary oclLoadLibrary(void)
{
#if defined(__APPLE__) || defined(__MACOSX)
	return dlopen("/System/Library/Frameworks/OpenCL.framework/Versions/Current/OpenCL", RTLD_NOW);
#else
	OclLibrary lib = dlopen("libOpenCL.so", RTLD_NOW);
	if (!lib) {
		lib = dlopen("libOpenCL.so.1", RTLD_NOW);
	}
	return lib;
#endif
}